

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O0

size_t tlv_get_tlvar(uint8_t *buf,size_t buflen,uint32_t *var)

{
  byte bVar1;
  uint8_t first_byte;
  uint32_t *var_local;
  size_t buflen_local;
  uint8_t *buf_local;
  
  bVar1 = *buf;
  if ((bVar1 < 0xfd) && (buflen != 0)) {
    *var = (uint)bVar1;
    buf_local = (uint8_t *)0x1;
  }
  else if ((bVar1 == 0xfd) && (2 < buflen)) {
    *var = (uint)buf[1] * 0x100 + (uint)buf[2];
    buf_local = (uint8_t *)0x3;
  }
  else if ((bVar1 == 0xfe) && (4 < buflen)) {
    *var = (uint)buf[1] * 0x1000000 + (uint)buf[2] * 0x10000 + (uint)buf[3] * 0x100 + (uint)buf[4];
    buf_local = (uint8_t *)0x5;
  }
  else {
    buf_local = (uint8_t *)0x0;
  }
  return (size_t)buf_local;
}

Assistant:

size_t
tlv_get_tlvar(uint8_t* buf, size_t buflen, uint32_t* var){
  uint8_t first_byte = buf[0];
  if(first_byte < 253 && buflen >= 1){
    *var = first_byte;
    return 1;
  }
  else if(first_byte == 253 && buflen >= 3) {
    *var = ((uint32_t)buf[1] << 8) + buf[2];
    return 3;
  }
  else if (first_byte == 254 && buflen >= 5) {
    *var = ((uint32_t)buf[1] << 24) +
           ((uint32_t)buf[2] << 16) +
           ((uint32_t)buf[3] << 8) +
           ((uint32_t)buf[4]);
    return 5;
  }
  else {
    return 0;
  }
}